

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

RepeatedPtrField<google::protobuf::Message> * __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::Message>::operator=
          (RepeatedPtrField<google::protobuf::Message> *this,
          RepeatedPtrField<google::protobuf::Message> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  RepeatedPtrField<google::protobuf::Message> *other_local;
  RepeatedPtrField<google::protobuf::Message> *this_local;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    pAVar2 = GetArena(other);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,other);
    }
    else {
      CopyFrom(this,other);
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    RepeatedPtrField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (GetArena() != other.GetArena()
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
        || GetArena() == nullptr
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
    ) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}